

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.c++
# Opt level: O0

void __thiscall kj::_::Mutex::~Mutex(Mutex *this)

{
  bool bVar1;
  Fault local_50;
  Fault f;
  uint *local_40;
  undefined1 local_38 [8];
  DebugComparison<unsigned_int_&,_int> _kjCondition;
  Mutex *this_local;
  
  _kjCondition._32_8_ = this;
  local_40 = (uint *)DebugExpressionStart::operator<<
                               ((DebugExpressionStart *)&_::MAGIC_ASSERT,&this->futex);
  f.exception._4_4_ = 0;
  DebugExpression<unsigned_int&>::operator==
            ((DebugComparison<unsigned_int_&,_int> *)local_38,
             (DebugExpression<unsigned_int&> *)&local_40,(int *)((long)&f.exception + 4));
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_38);
  if (!bVar1) {
    Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,int>&,char_const(&)[30]>
              (&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex.c++"
               ,0xa4,FAILED,"futex == 0","_kjCondition,\"Mutex destroyed while locked.\"",
               (DebugComparison<unsigned_int_&,_int> *)local_38,
               (char (*) [30])"Mutex destroyed while locked.");
    Debug::Fault::~Fault(&local_50);
  }
  return;
}

Assistant:

Mutex::~Mutex() {
  // This will crash anyway, might as well crash with a nice error message.
  KJ_ASSERT(futex == 0, "Mutex destroyed while locked.") { break; }
}